

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

optional<pbrt::SquareMatrix<2>_> * pbrt::Inverse<2>(SquareMatrix<2> *m)

{
  long lVar1;
  float *pfVar2;
  optional<pbrt::SquareMatrix<2>_> *in_RDI;
  span<const_float> *this;
  float fVar3;
  int k_3;
  int j_4;
  int k_2;
  Float save;
  int j_3;
  int j_2;
  Float pivinv;
  int k_1;
  int k;
  int j_1;
  Float big;
  int icol;
  int irow;
  int i_1;
  int j;
  int i;
  Float minv [2] [2];
  int ipiv [2];
  int indxr [2];
  int indxc [2];
  optional<pbrt::SquareMatrix<2>_> *this_00;
  SquareMatrix<2> local_98;
  int local_88;
  int local_84;
  int local_80;
  undefined4 local_7c;
  int local_78;
  int local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  float local_60;
  int local_5c;
  int local_58;
  int local_54;
  span<const_float> local_50;
  int local_40;
  int local_3c;
  span<const_float> local_38;
  span<const_float> local_28;
  int aiStack_18 [6];
  
  this = &local_28;
  this_00 = in_RDI;
  memset(this,0,8);
  for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < 2; local_40 = local_40 + 1) {
      local_50 = SquareMatrix<2>::operator[]
                           ((SquareMatrix<2> *)this_00,(int)((ulong)in_RDI >> 0x20));
      this = &local_50;
      pfVar2 = pstd::span<const_float>::operator[](this,(long)local_40);
      *(float *)((long)&local_38.ptr + (long)local_40 * 4 + (long)local_3c * 8) = *pfVar2;
    }
  }
  local_54 = 0;
  while( true ) {
    if (1 < local_54) {
      for (local_84 = 1; -1 < local_84; local_84 = local_84 + -1) {
        if (aiStack_18[(long)local_84 + -2] != aiStack_18[local_84]) {
          for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
            pstd::swap<float>((float *)((long)&local_38.ptr +
                                       (long)aiStack_18[(long)local_84 + -2] * 4 +
                                       (long)local_88 * 8),
                              (float *)((long)&local_38.ptr +
                                       (long)aiStack_18[local_84] * 4 + (long)local_88 * 8));
          }
        }
      }
      SquareMatrix<2>::SquareMatrix(&local_98,(Float (*) [2])&local_38);
      pstd::optional<pbrt::SquareMatrix<2>_>::optional(this_00,(SquareMatrix<2> *)in_RDI);
      return this_00;
    }
    local_58 = 0;
    local_5c = 0;
    local_60 = 0.0;
    for (local_64 = 0; local_64 < 2; local_64 = local_64 + 1) {
      if (*(int *)((long)&local_28.ptr + (long)local_64 * 4) != 1) {
        for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
          if (*(int *)((long)&local_28.ptr + (long)local_68 * 4) == 0) {
            fVar3 = *(float *)((long)&local_38.ptr + (long)local_68 * 4 + (long)local_64 * 8);
            std::abs((int)this);
            if (local_60 <= fVar3) {
              fVar3 = *(float *)((long)&local_38.ptr + (long)local_68 * 4 + (long)local_64 * 8);
              std::abs((int)this);
              local_58 = local_64;
              local_5c = local_68;
              local_60 = fVar3;
            }
          }
          else if (1 < *(int *)((long)&local_28.ptr + (long)local_68 * 4)) {
            memset(in_RDI,0,0x14);
            pstd::optional<pbrt::SquareMatrix<2>_>::optional(in_RDI);
            return this_00;
          }
        }
      }
    }
    *(int *)((long)&local_28.ptr + (long)local_5c * 4) =
         *(int *)((long)&local_28.ptr + (long)local_5c * 4) + 1;
    if (local_58 != local_5c) {
      for (local_6c = 0; local_6c < 2; local_6c = local_6c + 1) {
        this = (span<const_float> *)((long)&local_38.ptr + (long)local_6c * 4 + (long)local_58 * 8);
        pstd::swap<float>((float *)this,
                          (float *)((long)&local_38.ptr + (long)local_6c * 4 + (long)local_5c * 8));
      }
    }
    aiStack_18[(long)local_54 + -2] = local_58;
    aiStack_18[local_54] = local_5c;
    fVar3 = *(float *)((long)&local_38.ptr + (long)local_5c * 4 + (long)local_5c * 8);
    if ((fVar3 == 0.0) && (!NAN(fVar3))) break;
    local_70 = 1.0 / *(float *)((long)&local_38.ptr + (long)local_5c * 4 + (long)local_5c * 8);
    *(undefined4 *)((long)&local_38.ptr + (long)local_5c * 4 + (long)local_5c * 8) = 0x3f800000;
    for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
      lVar1 = (long)local_5c * 8 + -0x38;
      *(float *)((long)&local_38.ptr + (long)local_74 * 4 + lVar1 + 0x38) =
           local_70 * *(float *)((long)&local_38.ptr + (long)local_74 * 4 + lVar1 + 0x38);
    }
    for (local_78 = 0; local_78 < 2; local_78 = local_78 + 1) {
      if (local_78 != local_5c) {
        local_7c = *(undefined4 *)((long)&local_38.ptr + (long)local_5c * 4 + (long)local_78 * 8);
        *(undefined4 *)((long)&local_38.ptr + (long)local_5c * 4 + (long)local_78 * 8) = 0;
        for (local_80 = 0; local_80 < 2; local_80 = local_80 + 1) {
          fVar3 = FMA((float)((ulong)this_00 >> 0x20),SUB84(this_00,0),
                      (float)((ulong)in_RDI >> 0x20));
          *(float *)((long)&local_38.ptr + (long)local_80 * 4 + (long)local_78 * 8) = fVar3;
        }
      }
    }
    local_54 = local_54 + 1;
  }
  memset(in_RDI,0,0x14);
  pstd::optional<pbrt::SquareMatrix<2>_>::optional(in_RDI);
  return this_00;
}

Assistant:

PBRT_CPU_GPU pstd::optional<SquareMatrix<N>> Inverse(const SquareMatrix<N> &m) {
    int indxc[N], indxr[N];
    int ipiv[N] = {0};
    Float minv[N][N];
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            minv[i][j] = m[i][j];
    for (int i = 0; i < N; i++) {
        int irow = 0, icol = 0;
        Float big = 0.f;
        // Choose pivot
        for (int j = 0; j < N; j++) {
            if (ipiv[j] != 1) {
                for (int k = 0; k < N; k++) {
                    if (ipiv[k] == 0) {
                        if (std::abs(minv[j][k]) >= big) {
                            big = std::abs(minv[j][k]);
                            irow = j;
                            icol = k;
                        }
                    } else if (ipiv[k] > 1)
                        return {};  // singular
                }
            }
        }
        ++ipiv[icol];
        // Swap rows _irow_ and _icol_ for pivot
        if (irow != icol) {
            for (int k = 0; k < N; ++k)
                pstd::swap(minv[irow][k], minv[icol][k]);
        }
        indxr[i] = irow;
        indxc[i] = icol;
        if (minv[icol][icol] == 0.f)
            return {};  // singular

        // Set $m[icol][icol]$ to one by scaling row _icol_ appropriately
        Float pivinv = 1. / minv[icol][icol];
        minv[icol][icol] = 1.;
        for (int j = 0; j < N; j++)
            minv[icol][j] *= pivinv;

        // Subtract this row from others to zero out their columns
        for (int j = 0; j < N; j++) {
            if (j != icol) {
                Float save = minv[j][icol];
                minv[j][icol] = 0;
                for (int k = 0; k < N; k++)
                    minv[j][k] = FMA(-minv[icol][k], save, minv[j][k]);
            }
        }
    }
    // Swap columns to reflect permutation
    for (int j = N - 1; j >= 0; j--) {
        if (indxr[j] != indxc[j]) {
            for (int k = 0; k < N; k++)
                pstd::swap(minv[k][indxr[j]], minv[k][indxc[j]]);
        }
    }
    return SquareMatrix<N>(minv);
}